

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

void __thiscall
gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
          (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *this,long w,long h,long d)

{
  long k;
  unsigned_short *puVar1;
  unsigned_short **ppuVar2;
  unsigned_short ***pppuVar3;
  runtime_error *this_00;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (((this->width != w) || (this->height != h)) || (this->depth != d)) {
    if (this->n < 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"Cannot change size, because image is used as a wrapper");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (this->pixel != (unsigned_short *)0x0) {
      operator_delete__(this->pixel);
    }
    if (this->row != (unsigned_short **)0x0) {
      operator_delete__(this->row);
    }
    if (this->img != (unsigned_short ***)0x0) {
      operator_delete__(this->img);
    }
    iVar4 = (int)d;
    this->depth = iVar4;
    this->width = w;
    this->height = h;
    lVar5 = h * w * (long)iVar4;
    this->n = lVar5;
    this->img = (unsigned_short ***)0x0;
    this->pixel = (unsigned_short *)0x0;
    this->row = (unsigned_short **)0x0;
    if (0 < lVar5) {
      uVar7 = iVar4 * h;
      puVar1 = (unsigned_short *)operator_new__(lVar5 * 2);
      this->pixel = puVar1;
      ppuVar2 = (unsigned_short **)operator_new__(-(ulong)(uVar7 >> 0x3d != 0) | uVar7 * 8);
      this->row = ppuVar2;
      uVar6 = 0xffffffffffffffff;
      if (-1 < iVar4) {
        uVar6 = (d << 0x20) >> 0x1d;
      }
      pppuVar3 = (unsigned_short ***)operator_new__(uVar6);
      this->img = pppuVar3;
      *ppuVar2 = puVar1;
      for (lVar5 = 1; ppuVar2 = this->row, lVar5 < (long)uVar7; lVar5 = lVar5 + 1) {
        ppuVar2[lVar5] = ppuVar2[lVar5 + -1] + w;
      }
      *this->img = ppuVar2;
      for (lVar5 = 1; lVar5 < iVar4; lVar5 = lVar5 + 1) {
        this->img[lVar5] = this->img[lVar5 + -1] + h;
      }
    }
  }
  return;
}

Assistant:

void setSize(long w, long h, long d)
    {
      if (width != w || height != h || depth != d)
      {
        if (n < 0)
        {
          throw std::runtime_error("Cannot change size, because image is used as a wrapper");
        }

        if (pixel != 0)
        {
          delete [] pixel;
        }

        if (row != 0)
        {
          delete [] row;
        }

        if (img != 0)
        {
          delete [] img;
        }

        depth=d;
        width=w;
        height=h;
        n=width*height*depth;

        pixel=0;
        row=0;
        img=0;

        if (n > 0)
        {
          long m=height*depth;

          pixel=new T[n];
          row=new T*[m];
          img=new T **[depth];

          row[0]=pixel;

          for (long k=1; k<m; k++)
          {
            row[k]=row[k-1]+width;
          }

          img[0]=row;

          for (int j=1; j<depth; j++)
          {
            img[j]=img[j-1]+height;
          }
        }
      }
    }